

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

FloatTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetFloatTextureOrNull
          (TextureParameterDictionary *this,string *name,Allocator alloc)

{
  pointer pcVar1;
  long lVar2;
  char *pcVar3;
  _func_int **__n;
  int iVar4;
  int iVar5;
  ReturnType *pRVar6;
  const_iterator cVar7;
  long *in_RCX;
  long lVar8;
  char *fmt;
  pointer pcVar9;
  bool bVar10;
  ReturnType RVar11;
  ParameterDictionary *local_68;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar2 = *(long *)(pcVar1 + 0x58);
  pcVar9 = pcVar1 + 0x10;
  if (*(pointer *)(pcVar1 + 8) != (pointer)0x0) {
    pcVar9 = *(pointer *)(pcVar1 + 8);
  }
  local_68 = this->dict;
  bVar10 = lVar2 == 0;
  if (!bVar10) {
    lVar8 = 0;
    do {
      pcVar3 = *(char **)(pcVar9 + lVar8);
      __n = *(_func_int ***)(pcVar3 + 0x28);
      iVar5 = 3;
      if ((__n == alloc.memoryResource[1]._vptr_memory_resource) &&
         ((__n == (_func_int **)0x0 ||
          (iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar3 + 0x20))->_M_dataplus)._M_p,
                        (alloc.memoryResource)->_vptr_memory_resource,(size_t)__n), iVar5 = 3,
          iVar4 == 0)))) {
        iVar5 = std::__cxx11::string::compare(pcVar3);
        if (iVar5 == 0) {
          if (*(long *)(pcVar3 + 0x90) != 1) {
            if (*(long *)(pcVar3 + 0x90) == 0) {
              this->dict = local_68;
              fmt = "No texture name provided for parameter \"%s\".";
            }
            else {
              this->dict = local_68;
              fmt = "More than one texture name provided for parameter \"%s\".";
            }
            ErrorExit<std::__cxx11::string_const&>
                      ((FileLoc *)(pcVar3 + 0x40),fmt,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       alloc.memoryResource);
          }
          pcVar3[0xb8] = '\x01';
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
                          *)name->_M_string_length,*(key_type **)(pcVar3 + 0x80));
          if (cVar7._M_node == (_Base_ptr)(name->_M_string_length + 8)) {
            this->dict = local_68;
            ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((FileLoc *)(pcVar3 + 0x40),
                       "Couldn\'t find float texture named \"%s\" for parameter \"%s\"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pcVar3 + 0x80),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (pcVar3 + 0x20));
          }
          local_68 = *(ParameterDictionary **)(cVar7._M_node + 2);
          iVar5 = 1;
        }
        else {
          iVar4 = std::__cxx11::string::compare(pcVar3);
          iVar5 = 0;
          if (iVar4 == 0) {
            RVar11 = ParameterDictionary::lookupSingle<(pbrt::ParameterType)1>
                               ((ParameterDictionary *)(name->_M_dataplus)._M_p,
                                (string *)alloc.memoryResource,0.0);
            pRVar6 = (ReturnType *)(**(code **)(*in_RCX + 0x10))(in_RCX,4,4);
            *pRVar6 = RVar11;
            local_68 = (ParameterDictionary *)((ulong)pRVar6 | 0x5000000000000);
            iVar5 = 1;
          }
        }
      }
      if ((iVar5 != 3) && (iVar5 != 0)) {
        if (!bVar10) goto LAB_0031ff76;
        goto LAB_0031ff74;
      }
      lVar8 = lVar8 + 8;
      bVar10 = lVar2 << 3 == lVar8;
    } while (!bVar10);
  }
  this->dict = local_68;
LAB_0031ff74:
  local_68 = (ParameterDictionary *)0x0;
LAB_0031ff76:
  this->dict = local_68;
  return (FloatTextureHandle)this;
}

Assistant:

FloatTextureHandle TextureParameterDictionary::GetFloatTextureOrNull(
    const std::string &name, Allocator alloc) const {
    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = textures->floatTextures.find(p->strings[0]);
            if (iter != textures->floatTextures.end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find float texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "float") {
            Float v = GetOneFloat(name, 0.f);  // we know this will be found
            return alloc.new_object<FloatConstantTexture>(v);
        }
    }

    return nullptr;
}